

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void addArgumentToVtab(Parse *pParse)

{
  Table *pTable;
  char *pcVar1;
  
  pcVar1 = (pParse->sArg).z;
  if ((pcVar1 != (char *)0x0) && (pTable = pParse->pNewTable, pTable != (Table *)0x0)) {
    pcVar1 = sqlite3DbStrNDup(pParse->db,pcVar1,(long)(int)(pParse->sArg).n);
    addModuleArgument(pParse,pTable,pcVar1);
    return;
  }
  return;
}

Assistant:

static void addArgumentToVtab(Parse *pParse){
  if( pParse->sArg.z && pParse->pNewTable ){
    const char *z = (const char*)pParse->sArg.z;
    int n = pParse->sArg.n;
    sqlite3 *db = pParse->db;
    addModuleArgument(pParse, pParse->pNewTable, sqlite3DbStrNDup(db, z, n));
  }
}